

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkResizeVec(ARKodeMem ark_mem,ARKVecResizeFn resize,void *resize_data,sunindextype lrw_diff,
                sunindextype liw_diff,N_Vector tmpl,N_Vector *v)

{
  int iVar1;
  undefined8 uVar2;
  long in_RCX;
  undefined8 in_RDX;
  code *in_RSI;
  ARKodeMem in_RDI;
  long in_R8;
  undefined8 in_R9;
  
  if (*(long *)liw_diff != 0) {
    if (in_RSI == (code *)0x0) {
      N_VDestroy(*(undefined8 *)liw_diff);
      *(undefined8 *)liw_diff = 0;
      uVar2 = N_VClone(in_R9);
      *(undefined8 *)liw_diff = uVar2;
      if (*(long *)liw_diff == 0) {
        arkProcessError(in_RDI,-0x14,0xcd2,"arkResizeVec",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Unable to clone vector");
        return 0;
      }
    }
    else {
      iVar1 = (*in_RSI)(*(undefined8 *)liw_diff,in_R9,in_RDX);
      if (iVar1 != 0) {
        arkProcessError(in_RDI,-0x14,0xcdb,"arkResizeVec",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Error in user-supplied resize() function.");
        return 0;
      }
    }
    in_RDI->lrw = in_RCX + in_RDI->lrw;
    in_RDI->liw = in_R8 + in_RDI->liw;
  }
  return 1;
}

Assistant:

sunbooleantype arkResizeVec(ARKodeMem ark_mem, ARKVecResizeFn resize,
                            void* resize_data, sunindextype lrw_diff,
                            sunindextype liw_diff, N_Vector tmpl, N_Vector* v)
{
  if (*v != NULL)
  {
    if (resize == NULL)
    {
      N_VDestroy(*v);
      *v = NULL;
      *v = N_VClone(tmpl);
      if (*v == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "Unable to clone vector");
        return (SUNFALSE);
      }
    }
    else
    {
      if (resize(*v, tmpl, resize_data))
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RESIZE_FAIL);
        return (SUNFALSE);
      }
    }
    ark_mem->lrw += lrw_diff;
    ark_mem->liw += liw_diff;
  }
  return (SUNTRUE);
}